

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O3

bool is_valid(test_utf8_char s)

{
  int iVar1;
  char *__s;
  bool passed;
  
  iVar1 = cm_utf8_is_valid(s._M_str);
  passed = iVar1 != 0;
  __s = "expected valid, reported as invalid";
  if (passed) {
    __s = "valid as expected";
  }
  report_valid(passed,s);
  puts(__s);
  return passed;
}

Assistant:

static bool is_valid(test_utf8_char s)
{
  bool valid = cm_utf8_is_valid(s.data()) != 0;
  if (!valid) {
    report_valid(false, s);
    printf("expected valid, reported as invalid\n");
    return false;
  }
  report_valid(true, s);
  printf("valid as expected\n");
  return true;
}